

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::HexStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (HexStrOperator *this,string_t input,Vector *result)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  string_t sVar6;
  string_t target;
  undefined8 local_38;
  undefined4 *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = input.value._0_8_;
  lVar4 = local_20;
  if ((uint)this < 0xd) {
    lVar4 = (long)&local_28 + 4;
  }
  local_28 = this;
  auVar5 = duckdb::StringVector::EmptyString(input.value._8_8_,((ulong)this & 0xffffffff) * 2);
  local_30 = auVar5._8_8_;
  local_38 = auVar5._0_8_;
  uVar1 = auVar5._0_4_;
  if ((uint)this != 0) {
    lVar3 = (long)local_30;
    if (uVar1 < 0xd) {
      lVar3 = (long)&local_38 + 4;
    }
    uVar2 = 0;
    do {
      *(char *)(lVar3 + uVar2 * 2) = "0123456789ABCDEF"[*(byte *)(lVar4 + uVar2) >> 4];
      *(char *)(lVar3 + uVar2 * 2 + 1) = "0123456789ABCDEF"[*(byte *)(lVar4 + uVar2) & 0xf];
      uVar2 = uVar2 + 1;
    } while (((ulong)this & 0xffffffff) != uVar2);
    auVar5._8_8_ = local_30;
    auVar5._0_8_ = local_38 & 0xffffffff;
  }
  local_30 = auVar5._8_8_;
  if (auVar5._0_4_ < 0xd) {
    uVar2 = auVar5._0_8_ & 0xffffffff;
    memset((void *)((long)&local_38 + 4 + uVar2),0,0xc - uVar2);
  }
  else {
    local_38 = CONCAT44(*local_30,uVar1);
  }
  sVar6.value.pointer.ptr = (char *)local_30;
  sVar6.value._0_8_ = local_38;
  return (string_t)sVar6.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 2);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			*output = Blob::HEX_TABLE[(data[i] >> 4) & 0x0F];
			output++;
			*output = Blob::HEX_TABLE[data[i] & 0x0F];
			output++;
		}

		target.Finalize();
		return target;
	}